

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_syslog.c
# Opt level: O0

void ngx_syslog_writer(ngx_log_t *log,ngx_uint_t level,u_char *buf,size_t len)

{
  ngx_syslog_peer_t *peer_00;
  ngx_syslog_peer_t *peer;
  ngx_uint_t head_len;
  u_char msg [2359];
  u_char *p;
  size_t len_local;
  u_char *buf_local;
  ngx_uint_t level_local;
  ngx_log_t *log_local;
  
  peer_00 = (ngx_syslog_peer_t *)log->wdata;
  if ((peer_00->field_0x128 & 1) == 0) {
    peer_00->field_0x128 = peer_00->field_0x128 & 0xfe | 1;
    peer_00->severity = level - 1;
    register0x00000000 = ngx_syslog_add_header(peer_00,(u_char *)&head_len);
    p = (u_char *)(len - 1);
    if ((u_char *)(0x937U - ((long)register0x00000000 - (long)&head_len)) < p) {
      p = (u_char *)(0x937 - ((long)register0x00000000 - (long)&head_len));
    }
    register0x00000000 = ngx_snprintf(register0x00000000,(size_t)p,"%s",buf);
    ngx_syslog_send(peer_00,(u_char *)&head_len,(long)register0x00000000 - (long)&head_len);
    peer_00->field_0x128 = peer_00->field_0x128 & 0xfe;
  }
  return;
}

Assistant:

void
ngx_syslog_writer(ngx_log_t *log, ngx_uint_t level, u_char *buf,
    size_t len)
{
    u_char             *p, msg[NGX_SYSLOG_MAX_STR];
    ngx_uint_t          head_len;
    ngx_syslog_peer_t  *peer;

    peer = log->wdata;

    if (peer->busy) {
        return;
    }

    peer->busy = 1;
    peer->severity = level - 1;

    p = ngx_syslog_add_header(peer, msg);
    head_len = p - msg;

    len -= NGX_LINEFEED_SIZE;

    if (len > NGX_SYSLOG_MAX_STR - head_len) {
        len = NGX_SYSLOG_MAX_STR - head_len;
    }

    p = ngx_snprintf(p, len, "%s", buf);

    (void) ngx_syslog_send(peer, msg, p - msg);

    peer->busy = 0;
}